

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::XMLDateTime::getDateTimeCanonicalRepresentation
          (XMLDateTime *this,MemoryManager *memMgr)

{
  int iVar1;
  undefined4 extraout_var;
  XMLCh *pXVar2;
  MemoryManager *local_70;
  XMLCh *tmpBuf;
  XMLCh *pXStack_50;
  int additionalLen;
  XMLCh *retPtr;
  XMLCh *retBuf;
  MemoryManager *toUse;
  XMLSize_t XStack_30;
  int utcSize;
  XMLSize_t miliSecondsLen;
  XMLCh *miliEndPtr;
  XMLCh *miliStartPtr;
  MemoryManager *memMgr_local;
  XMLDateTime *this_local;
  
  miliStartPtr = (XMLCh *)memMgr;
  memMgr_local = (MemoryManager *)this;
  searchMiliSeconds(this,&miliEndPtr,(XMLCh **)&miliSecondsLen);
  XStack_30 = (long)(miliSecondsLen - (long)miliEndPtr) >> 1;
  toUse._4_4_ = (uint)(this->fValue[7] != 0);
  if (miliStartPtr == (XMLCh *)0x0) {
    local_70 = this->fMemoryManager;
  }
  else {
    local_70 = (MemoryManager *)miliStartPtr;
  }
  retBuf = (XMLCh *)local_70;
  iVar1 = (*local_70->_vptr_MemoryManager[3])
                    (local_70,(XStack_30 + (long)(int)toUse._4_4_ + 0x16) * 2);
  pXStack_50 = (XMLCh *)CONCAT44(extraout_var,iVar1);
  retPtr = pXStack_50;
  iVar1 = fillYearString(this,&stack0xffffffffffffffb0,this->fValue[0]);
  if (iVar1 != 0) {
    pXVar2 = (XMLCh *)(**(code **)(*(long *)retBuf + 0x18))
                                (retBuf,((long)(iVar1 + 0x15) + XStack_30 + 2) * 2);
    XMLString::moveChars(pXVar2,retPtr,(long)(iVar1 + 4));
    pXStack_50 = pXVar2 + ((long)pXStack_50 - (long)retPtr >> 1);
    (**(code **)(*(long *)retBuf + 0x20))(retBuf,retPtr);
    retPtr = pXVar2;
  }
  *pXStack_50 = L'-';
  pXStack_50 = pXStack_50 + 1;
  fillString(this,&stack0xffffffffffffffb0,this->fValue[1],2);
  *pXStack_50 = L'-';
  pXStack_50 = pXStack_50 + 1;
  fillString(this,&stack0xffffffffffffffb0,this->fValue[2],2);
  *pXStack_50 = L'T';
  pXStack_50 = pXStack_50 + 1;
  fillString(this,&stack0xffffffffffffffb0,this->fValue[3],2);
  if (this->fValue[3] == 0x18) {
    pXStack_50[-2] = L'0';
    pXStack_50[-1] = L'0';
  }
  *pXStack_50 = L':';
  pXStack_50 = pXStack_50 + 1;
  fillString(this,&stack0xffffffffffffffb0,this->fValue[4],2);
  *pXStack_50 = L':';
  pXStack_50 = pXStack_50 + 1;
  fillString(this,&stack0xffffffffffffffb0,this->fValue[5],2);
  if (XStack_30 != 0) {
    pXVar2 = pXStack_50 + 1;
    *pXStack_50 = L'.';
    pXStack_50 = pXVar2;
    XMLString::copyNString(pXVar2,miliEndPtr,XStack_30);
    pXStack_50 = pXStack_50 + XStack_30;
  }
  if (toUse._4_4_ != 0) {
    *pXStack_50 = L'Z';
    pXStack_50 = pXStack_50 + 1;
  }
  *pXStack_50 = L'\0';
  return retPtr;
}

Assistant:

XMLCh* XMLDateTime::getDateTimeCanonicalRepresentation(MemoryManager* const memMgr) const
{
    XMLCh *miliStartPtr, *miliEndPtr;
    searchMiliSeconds(miliStartPtr, miliEndPtr);
    XMLSize_t miliSecondsLen = miliEndPtr - miliStartPtr;
    int utcSize = (fValue[utc] == UTC_UNKNOWN) ? 0 : 1;

    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    XMLCh* retBuf = (XMLCh*) toUse->allocate( (21 + miliSecondsLen + utcSize + 1) * sizeof(XMLCh));
    XMLCh* retPtr = retBuf;

    // (-?) cc+yy-mm-dd'T'hh:mm:ss'Z'    ('.'s+)?
    //      2+  8       1      8   1
    //
    int additionalLen = fillYearString(retPtr, fValue[CentYear]);
    if(additionalLen != 0)
    {
        // very bad luck; have to resize the buffer...
        XMLCh *tmpBuf = (XMLCh*) toUse->allocate( (additionalLen+21+miliSecondsLen +2) * sizeof(XMLCh));
        XMLString::moveChars(tmpBuf, retBuf, 4+additionalLen);
        retPtr = tmpBuf+(retPtr-retBuf);
        toUse->deallocate(retBuf);
        retBuf = tmpBuf;
    }
    *retPtr++ = DATE_SEPARATOR;
    fillString(retPtr, fValue[Month], 2);
    *retPtr++ = DATE_SEPARATOR;
    fillString(retPtr, fValue[Day], 2);
    *retPtr++ = DATETIME_SEPARATOR;

    fillString(retPtr, fValue[Hour], 2);
    if (fValue[Hour] == 24)
    {
        *(retPtr - 2) = chDigit_0;
        *(retPtr - 1) = chDigit_0;
    }
    *retPtr++ = TIME_SEPARATOR;
    fillString(retPtr, fValue[Minute], 2);
    *retPtr++ = TIME_SEPARATOR;
    fillString(retPtr, fValue[Second], 2);

    if (miliSecondsLen)
    {
        *retPtr++ = chPeriod;
        XMLString::copyNString(retPtr, miliStartPtr, miliSecondsLen);
        retPtr += miliSecondsLen;
    }

    if (utcSize)
        *retPtr++ = UTC_STD_CHAR;
    *retPtr = chNull;

    return retBuf;
}